

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O1

uint QNetworkInterfaceManager::interfaceIndexFromName(QString *name)

{
  int __fd;
  int iVar1;
  int *piVar2;
  uint uVar3;
  long in_FS_OFFSET;
  ifreq req;
  QArrayData *local_70;
  undefined8 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  if ((ulong)(name->d).size < 0x10) {
    uVar3 = 0;
    __fd = ::socket(2,0x80002,0);
    if (-1 < __fd) {
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaa00000000;
      QString::toLatin1_helper((QString *)&local_70);
      if (local_68 == (undefined8 *)0x0) {
        local_68 = &QByteArray::_empty;
      }
      __strcpy_chk(&local_58,local_68,0x28);
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,1,0x10);
        }
      }
      iVar1 = ioctl(__fd,0x8933,&local_58);
      uVar3 = 0;
      if (-1 < iVar1) {
        uVar3 = (uint)local_48;
      }
      do {
        iVar1 = ::close(__fd);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint QNetworkInterfaceManager::interfaceIndexFromName(const QString &name)
{
    uint index = 0;
    if (name.size() >= IFNAMSIZ)
        return index;

    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = 0;
        strcpy(req.ifr_name, name.toLatin1().constData());

        if (qt_safe_ioctl(socket, SIOCGIFINDEX, &req) >= 0)
            index = req.ifr_ifindex;
        qt_safe_close(socket);
    }
    return index;
}